

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void page_to_char(char *txt,CHAR_DATA *ch)

{
  descriptor_data *d;
  size_t sVar1;
  char *__dest;
  
  if ((txt != (char *)0x0) && (d = ch->desc, d != (descriptor_data *)0x0)) {
    if (ch->lines != 0) {
      sVar1 = strlen(txt);
      __dest = (char *)operator_new__(sVar1 + 1);
      d->showstr_head = __dest;
      strcpy(__dest,txt);
      d->showstr_point = __dest;
      show_string(d,"");
      return;
    }
    send_to_char(txt,ch);
    return;
  }
  return;
}

Assistant:

void page_to_char(const char *txt, CHAR_DATA *ch)
{
	if (txt == nullptr || ch->desc == nullptr)
		return;

	if (ch->lines == 0)
	{
		send_to_char(txt, ch);
		return;
	}

	ch->desc->showstr_head = new char[strlen(txt) + 1];
	strcpy(ch->desc->showstr_head, txt);

	ch->desc->showstr_point = ch->desc->showstr_head;
	show_string(ch->desc, "");
}